

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::ComputeShape
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,TPZVec<double> *qsi,TPZMaterialData *data)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  TPZGeoEl *pTVar4;
  long *plVar5;
  ulong uVar6;
  double local_1a8;
  TPZFMatrix<double> phiMaster;
  TPZFNMatrix<9,_double> gradx;
  
  iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 600))();
  TPZFMatrix<double>::TPZFMatrix(&phiMaster);
  if (this->fhdivfam == EHDivConstant) {
    TPZFMatrix<double>::Resize(&phiMaster,1,(long)iVar2);
    TPZFMatrix<double>::Resize(&(data->divphi).super_TPZFMatrix<double>,(long)iVar2,1);
    TPZShapeHDivConstant<pzshape::TPZShapeLinear>::Shape
              (qsi,&data->super_TPZShapeData,&phiMaster,&(data->divphi).super_TPZFMatrix<double>);
  }
  else {
    if (this->fhdivfam != EHDivStandard) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp"
                 ,0x369);
    }
    TPZShapeHDiv<pzshape::TPZShapeLinear>::Shape
              (qsi,&data->super_TPZShapeData,&phiMaster,&(data->divphi).super_TPZFMatrix<double>);
  }
  uVar1 = (uint)(data->divphi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                fRow;
  uVar6 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar6;
  }
  plVar5 = &((data->fVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore)->second;
  for (; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    ((pair<int,_long> *)(plVar5 + -1))->first = (int)uVar6;
    *plVar5 = uVar6;
    plVar5 = plVar5 + 2;
  }
  local_1a8 = 0.0;
  TPZFNMatrix<9,_double>::TPZFNMatrix(&gradx,3,1,&local_1a8);
  pTVar4 = TPZCompEl::Reference((TPZCompEl *)this);
  (**(code **)(*(long *)pTVar4 + 0x230))(pTVar4,qsi,&gradx);
  TPZFMatrix<double>::MultAdd
            (&gradx.super_TPZFMatrix<double>,&phiMaster,
             &(data->fDeformedDirections).super_TPZFMatrix<double>,
             &(data->fDeformedDirections).super_TPZFMatrix<double>,1.0 / ABS(data->detjac),0.0,0);
  TPZFMatrix<double>::operator*=(&(data->divphi).super_TPZFMatrix<double>,1.0 / ABS(data->detjac));
  TPZFMatrix<double>::operator=(&(data->phi).super_TPZFMatrix<double>,1.0);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&gradx);
  TPZFMatrix<double>::~TPZFMatrix(&phiMaster);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::ComputeShape(TPZVec<REAL> &qsi, TPZMaterialData &data) {

    constexpr int dim = TSHAPE::Dimension;
    const int nshape = this->NShapeF();
    TPZShapeData &shapedata = data;
    TPZFMatrix<REAL> phiMaster;

    switch (fhdivfam)
    {
    case HDivFamily::EHDivStandard:
        TPZShapeHDiv<TSHAPE>::Shape(qsi, shapedata, phiMaster, data.divphi);
        break;

    case HDivFamily::EHDivConstant:
        phiMaster.Resize(TSHAPE::Dimension,nshape);
        data.divphi.Resize(nshape,1);
        TPZShapeHDivConstant<TSHAPE>::Shape(qsi, shapedata, phiMaster, data.divphi);
        break;

    default:
        DebugStop();
        break;
    }

    //This is for legacy material classes - will be deleted in the future
    int shapeSize = data.divphi.Rows();

    for (int i = 0; i < shapeSize; i++){
        data.fVecShapeIndex[i] = make_pair(i,i);
    }
    //
    
    TPZFNMatrix<9,REAL> gradx(3,TSHAPE::Dimension,0.);
    this->Reference()->GradX(qsi, gradx);
    gradx.MultAdd(phiMaster,data.fDeformedDirections,data.fDeformedDirections,1./fabs(data.detjac));
    data.divphi *= 1/fabs(data.detjac);
    data.phi = 1.;

}